

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unicodeAddExceptions(unicode_tokenizer *p,int bAlnum,char *zIn,int nIn)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int *piVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  byte *pbVar10;
  int iVar11;
  uint uVar12;
  byte *pbVar13;
  
  pbVar10 = (byte *)(zIn + (uint)nIn);
  iVar11 = 0;
  if (nIn != 0) {
    iVar11 = 0;
    pbVar13 = (byte *)zIn;
    do {
      bVar1 = *pbVar13;
      uVar12 = (uint)bVar1;
      pbVar13 = pbVar13 + 1;
      if (0xbf < bVar1) {
        uVar2 = (uint)""[bVar1 - 0xc0];
        for (; (pbVar13 < pbVar10 && ((*pbVar13 & 0xffffffc0) == 0x80)); pbVar13 = pbVar13 + 1) {
          uVar2 = uVar2 << 6 | *pbVar13 & 0x3f;
        }
        uVar12 = uVar2;
        if ((uVar2 & 0xfffff800) == 0xd800) {
          uVar12 = 0xfffd;
        }
        if (uVar2 < 0x80) {
          uVar12 = 0xfffd;
        }
        if ((uVar2 & 0xfffffffe) == 0xfffe) {
          uVar12 = 0xfffd;
        }
      }
      iVar3 = sqlite3FtsUnicodeIsalnum(uVar12);
      if (iVar3 != bAlnum) {
        uVar2 = 0;
        if (0xffffffcd < uVar12 - 0x332) {
          uVar2 = 1 << ((byte)uVar12 & 0x1f);
          if ((int)uVar12 < 800) {
            uVar2 = uVar2 & 0x8029fdf;
          }
          else {
            uVar2 = uVar2 & 0x361f8;
          }
        }
        iVar11 = iVar11 + (uint)(uVar2 == 0);
      }
    } while (pbVar13 < pbVar10);
  }
  iVar3 = 0;
  if (iVar11 != 0) {
    piVar6 = p->aiException;
    iVar3 = p->nException;
    iVar4 = sqlite3_initialize();
    if (iVar4 == 0) {
      piVar6 = (int *)sqlite3Realloc(piVar6,((long)iVar3 + (long)iVar11) * 4);
    }
    else {
      piVar6 = (int *)0x0;
    }
    if (piVar6 == (int *)0x0) {
      iVar3 = 7;
    }
    else {
      uVar12 = p->nException;
      if (nIn != 0) {
        do {
          bVar1 = *zIn;
          uVar2 = (uint)bVar1;
          zIn = (char *)((byte *)zIn + 1);
          if (0xbf < bVar1) {
            uVar5 = (uint)""[bVar1 - 0xc0];
            for (; (zIn < pbVar10 && (((byte)*zIn & 0xffffffc0) == 0x80));
                zIn = (char *)((byte *)zIn + 1)) {
              uVar5 = uVar5 << 6 | (byte)*zIn & 0x3f;
            }
            uVar2 = uVar5;
            if ((uVar5 & 0xfffff800) == 0xd800) {
              uVar2 = 0xfffd;
            }
            if (uVar5 < 0x80) {
              uVar2 = 0xfffd;
            }
            if ((uVar5 & 0xfffffffe) == 0xfffe) {
              uVar2 = 0xfffd;
            }
          }
          iVar11 = sqlite3FtsUnicodeIsalnum(uVar2);
          if (iVar11 != bAlnum) {
            uVar5 = 0;
            if (0xffffffcd < uVar2 - 0x332) {
              uVar5 = 1 << ((byte)uVar2 & 0x1f);
              if ((int)uVar2 < 800) {
                uVar5 = uVar5 & 0x8029fdf;
              }
              else {
                uVar5 = uVar5 & 0x361f8;
              }
            }
            if (uVar5 == 0) {
              if ((int)uVar12 < 1) {
                uVar8 = 0;
              }
              else {
                uVar7 = 0;
                do {
                  uVar8 = uVar7;
                  if ((int)uVar2 <= piVar6[uVar7]) break;
                  uVar7 = uVar7 + 1;
                  uVar8 = (ulong)uVar12;
                } while (uVar12 != uVar7);
              }
              if ((int)uVar8 < (int)uVar12) {
                lVar9 = (long)(int)uVar12;
                do {
                  piVar6[lVar9] = piVar6[lVar9 + -1];
                  lVar9 = lVar9 + -1;
                } while ((int)uVar8 < lVar9);
              }
              piVar6[uVar8 & 0xffffffff] = uVar2;
              uVar12 = uVar12 + 1;
            }
          }
        } while (zIn < pbVar10);
      }
      p->aiException = piVar6;
      p->nException = uVar12;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static int unicodeAddExceptions(
  unicode_tokenizer *p,           /* Tokenizer to add exceptions to */
  int bAlnum,                     /* Replace Isalnum() return value with this */
  const char *zIn,                /* Array of characters to make exceptions */
  int nIn                         /* Length of z in bytes */
){
  const unsigned char *z = (const unsigned char *)zIn;
  const unsigned char *zTerm = &z[nIn];
  unsigned int iCode;
  int nEntry = 0;

  assert( bAlnum==0 || bAlnum==1 );

  while( z<zTerm ){
    READ_UTF8(z, zTerm, iCode);
    assert( (sqlite3FtsUnicodeIsalnum((int)iCode) & 0xFFFFFFFE)==0 );
    if( sqlite3FtsUnicodeIsalnum((int)iCode)!=bAlnum
     && sqlite3FtsUnicodeIsdiacritic((int)iCode)==0
    ){
      nEntry++;
    }
  }

  if( nEntry ){
    int *aNew;                    /* New aiException[] array */
    int nNew;                     /* Number of valid entries in array aNew[] */

    aNew = sqlite3_realloc64(p->aiException,(p->nException+nEntry)*sizeof(int));
    if( aNew==0 ) return SQLITE_NOMEM;
    nNew = p->nException;

    z = (const unsigned char *)zIn;
    while( z<zTerm ){
      READ_UTF8(z, zTerm, iCode);
      if( sqlite3FtsUnicodeIsalnum((int)iCode)!=bAlnum
       && sqlite3FtsUnicodeIsdiacritic((int)iCode)==0
      ){
        int i, j;
        for(i=0; i<nNew && aNew[i]<(int)iCode; i++);
        for(j=nNew; j>i; j--) aNew[j] = aNew[j-1];
        aNew[i] = (int)iCode;
        nNew++;
      }
    }
    p->aiException = aNew;
    p->nException = nNew;
  }

  return SQLITE_OK;
}